

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O3

int __thiscall userinfo_t::GenderChanged(userinfo_t *this,char *gendername)

{
  uint uVar1;
  Node *pNVar2;
  UCVarValue value;
  FName local_14;
  
  uVar1 = D_GenderToInt(gendername);
  pNVar2 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::GetNode
                     (&this->
                       super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                      ,&local_14);
  value._4_4_ = 0;
  value.Int = uVar1;
  FBaseCVar::SetGenericRep((pNVar2->Pair).Value,value,CVAR_Int);
  return uVar1;
}

Assistant:

int userinfo_t::GenderChanged(const char *gendername)
{
	int gendernum = D_GenderToInt(gendername);
	*static_cast<FIntCVar *>((*this)[NAME_Gender]) = gendernum;
	return gendernum;
}